

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O2

longdouble * __thiscall
TPZGaussRule::JacobiPolinomial
          (longdouble *__return_storage_ptr__,TPZGaussRule *this,longdouble x,int order,
          longdouble alpha,longdouble beta,TPZVec<long_double> *b,TPZVec<long_double> *c,
          longdouble *dp2,longdouble *p1)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble *plVar3;
  longdouble *plVar4;
  undefined4 in_register_00000014;
  long lVar5;
  long lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  
  *dp2 = (longdouble)1;
  lVar7 = (alpha - beta) / (alpha + beta + (longdouble)2.0) + x;
  *(longdouble *)c = (longdouble)1;
  plVar3 = *(longdouble **)(CONCAT44(in_register_00000014,order) + 8);
  plVar4 = b->fStore;
  lVar8 = (longdouble)0;
  lVar6 = 0x10;
  for (lVar5 = 2; lVar5 <= (int)this; lVar5 = lVar5 + 1) {
    lVar1 = *dp2;
    *dp2 = lVar7;
    lVar2 = *(longdouble *)((long)plVar4 + lVar6);
    lVar10 = lVar8 * lVar2;
    lVar8 = *(longdouble *)c;
    lVar9 = x - *(longdouble *)((long)plVar3 + lVar6);
    lVar11 = lVar9 * lVar8 + lVar7;
    lVar7 = lVar9 * lVar7 - lVar1 * lVar2;
    *(longdouble *)c = lVar11 - lVar10;
    lVar6 = lVar6 + 0x10;
  }
  return plVar3;
}

Assistant:

long double TPZGaussRule::JacobiPolinomial(long double x, int order,long double alpha, long double beta, 
							TPZVec<long double> &b, TPZVec<long double> &c,long double *dp2, long double *p1 )
{
	long double p2, p0, dp0, dp1;
	int i;
	
	*p1 = 1.0L;
	dp1 = 0.0L;	
	p2 = x + (alpha - beta)/(alpha + beta + 2.0L);
	*dp2 = 1.0L;
	
	for(i=2;i<=order;i++) {
		p0 = *p1;
		dp0 = dp1;
		
		*p1 = p2;
		dp1 = *dp2;
		
		p2 = (x - b[i-1])*(*p1) - c[i-1]*p0;
		*dp2 = (x - b[i-1])*dp1 + (*p1) - c[i-1]*dp0;
	}
	return p2;
}